

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

int uv_utf16_to_wtf8(uint16_t *w_source_ptr,ssize_t w_source_len,char **target_ptr,
                    size_t *target_len_ptr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int32_t iVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  int32_t code_point;
  char *target_end;
  char *target;
  size_t target_len;
  size_t *target_len_ptr_local;
  char **target_ptr_local;
  ssize_t w_source_len_local;
  uint16_t *w_source_ptr_local;
  
  if ((target_ptr == (char **)0x0) || (*target_ptr == (char *)0x0)) {
    target = (char *)uv_utf16_length_as_wtf8(w_source_ptr,w_source_len);
    if (target_len_ptr != (size_t *)0x0) {
      *target_len_ptr = (size_t)target;
    }
  }
  else {
    target = (char *)*target_len_ptr;
  }
  if (target_ptr == (char **)0x0) {
    w_source_ptr_local._4_4_ = 0;
  }
  else {
    if (*target_ptr == (char *)0x0) {
      target_end = (char *)uv__malloc((size_t)(target + 1));
      if (target_end == (char *)0x0) {
        return -0xc;
      }
      *target_ptr = target_end;
    }
    else {
      target_end = *target_ptr;
    }
    pbVar5 = (byte *)(target_end + (long)target);
    target_ptr_local = (char **)w_source_len;
    w_source_len_local = (ssize_t)w_source_ptr;
    while (pbVar7 = (byte *)target_end,
          (byte *)target_end != pbVar5 && target_ptr_local != (char **)0x0) {
      iVar4 = uv__get_surrogate_value((uint16_t *)w_source_len_local,(ssize_t)target_ptr_local);
      if (iVar4 < 0) {
        __assert_fail("code_point >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/idna.c"
                      ,499,"int uv_utf16_to_wtf8(const uint16_t *, ssize_t, char **, size_t *)");
      }
      if (((long)target_ptr_local < 0) && (iVar4 == 0)) {
        target_ptr_local = (char **)0x0;
        break;
      }
      bVar3 = (byte)iVar4;
      if (iVar4 < 0x80) {
        *target_end = bVar3;
        target_end = target_end + 1;
      }
      else {
        bVar1 = (byte)(iVar4 >> 6);
        if (iVar4 < 0x800) {
          pbVar7 = (byte *)(target_end + 1);
          *target_end = bVar1 | 0xc0;
          if (pbVar7 == pbVar5) break;
          target_end = target_end + 2;
          *pbVar7 = bVar3 & 0x3f | 0x80;
        }
        else {
          bVar2 = (byte)(iVar4 >> 0xc);
          if (iVar4 < 0x10000) {
            pbVar7 = (byte *)(target_end + 1);
            *target_end = bVar2 | 0xe0;
            if (pbVar7 == pbVar5) break;
            pbVar8 = (byte *)(target_end + 2);
            *pbVar7 = bVar1 & 0x3f | 0x80;
            pbVar7 = pbVar8;
            if (pbVar8 == pbVar5) break;
            target_end = target_end + 3;
            *pbVar8 = bVar3 & 0x3f | 0x80;
          }
          else {
            pbVar7 = (byte *)(target_end + 1);
            *target_end = (byte)(iVar4 >> 0x12) | 0xf0;
            if (pbVar7 == pbVar5) break;
            pbVar8 = (byte *)(target_end + 2);
            *pbVar7 = bVar2 & 0x3f | 0x80;
            pbVar7 = pbVar8;
            if (pbVar8 == pbVar5) break;
            pbVar7 = (byte *)(target_end + 3);
            *pbVar8 = bVar1 & 0x3f | 0x80;
            if (pbVar7 == pbVar5) break;
            target_end = target_end + 4;
            *pbVar7 = bVar3 & 0x3f | 0x80;
            w_source_len_local = w_source_len_local + 2;
            if (0 < (long)target_ptr_local) {
              target_ptr_local = (char **)((long)target_ptr_local + -1);
            }
          }
        }
      }
      target = target_end + -(long)*target_ptr;
      w_source_len_local = w_source_len_local + 2;
      if (0 < (long)target_ptr_local) {
        target_ptr_local = (char **)((long)target_ptr_local + -1);
      }
    }
    target_end = (char *)pbVar7;
    if (((byte *)target_end != pbVar5) && (target_len_ptr != (size_t *)0x0)) {
      *target_len_ptr = (long)target_end - (long)*target_ptr;
    }
    if ((((long)target_ptr_local < 0) && ((byte *)target_end == pbVar5)) &&
       (*(short *)w_source_len_local == 0)) {
      target_ptr_local = (char **)0x0;
    }
    *target_end = '\0';
    if (target_ptr_local == (char **)0x0) {
      w_source_ptr_local._4_4_ = 0;
    }
    else {
      if (target_len_ptr != (size_t *)0x0) {
        sVar6 = uv_utf16_length_as_wtf8((uint16_t *)w_source_len_local,(ssize_t)target_ptr_local);
        *target_len_ptr = (size_t)(target + sVar6);
      }
      w_source_ptr_local._4_4_ = -0x69;
    }
  }
  return w_source_ptr_local._4_4_;
}

Assistant:

int uv_utf16_to_wtf8(const uint16_t* w_source_ptr,
                     ssize_t w_source_len,
                     char** target_ptr,
                     size_t* target_len_ptr) {
  size_t target_len;
  char* target;
  char* target_end;
  int32_t code_point;

  /* If *target_ptr is provided, then *target_len_ptr must be its length
   * (excluding space for NUL), otherwise we will compute the target_len_ptr
   * length and may return a new allocation in *target_ptr if target_ptr is
   * provided. */
  if (target_ptr == NULL || *target_ptr == NULL) {
    target_len = uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len;
  } else {
    target_len = *target_len_ptr;
  }

  if (target_ptr == NULL)
    return 0;

  if (*target_ptr == NULL) {
    target = uv__malloc(target_len + 1);
    if (target == NULL) {
      return UV_ENOMEM;
    }
    *target_ptr = target;
  } else {
    target = *target_ptr;
  }

  target_end = target + target_len;

  while (target != target_end && w_source_len) {
    code_point = uv__get_surrogate_value(w_source_ptr, w_source_len);
    /* Can be invalid UTF-8 but must be valid WTF-8. */
    assert(code_point >= 0);
    if (w_source_len < 0 && code_point == 0) {
      w_source_len = 0;
      break;
    }
    if (code_point < 0x80) {
      *target++ = code_point;
    } else if (code_point < 0x800) {
      *target++ = 0xC0 | (code_point >> 6);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else if (code_point < 0x10000) {
      *target++ = 0xE0 | (code_point >> 12);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else {
      *target++ = 0xF0 | (code_point >> 18);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 12) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
      /* uv__get_surrogate_value consumed 2 input characters */
      w_source_ptr++;
      if (w_source_len > 0)
        w_source_len--;
    }
    target_len = target - *target_ptr;
    w_source_ptr++;
    if (w_source_len > 0)
      w_source_len--;
  }

  if (target != target_end && target_len_ptr != NULL)
    /* Did not fill all of the provided buffer, so update the target_len_ptr
     * output with the space used. */
    *target_len_ptr = target - *target_ptr;

  /* Check if input fit into target exactly. */
  if (w_source_len < 0 && target == target_end && w_source_ptr[0] == 0)
    w_source_len = 0;

  *target++ = '\0';

  /* Characters remained after filling the buffer, compute the remaining length now. */
  if (w_source_len) {
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len + uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    return UV_ENOBUFS;
  }

  return 0;
}